

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *ws)

{
  void *pvVar1;
  
  pvVar1 = ws->objectEnd;
  if (pvVar1 < ws->workspace) {
    __assert_fail("ws->workspace <= ws->objectEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4162,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->tableEnd < pvVar1) {
    __assert_fail("ws->objectEnd <= ws->tableEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4163,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->tableValidEnd < pvVar1) {
    __assert_fail("ws->objectEnd <= ws->tableValidEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4164,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  pvVar1 = ws->allocStart;
  if (pvVar1 < ws->tableEnd) {
    __assert_fail("ws->tableEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4165,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (pvVar1 < ws->tableValidEnd) {
    __assert_fail("ws->tableValidEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4166,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->workspaceEnd < pvVar1) {
    __assert_fail("ws->allocStart <= ws->workspaceEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4167,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if ((void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0) < ws->initOnceStart) {
    __assert_fail("ws->initOnceStart <= ZSTD_cwksp_initialAllocStart(ws)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4168,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
  }
  if (ws->workspace <= ws->initOnceStart) {
    return;
  }
  __assert_fail("ws->workspace <= ws->initOnceStart",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4169,"void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp *)");
}

Assistant:

MEM_STATIC void ZSTD_cwksp_assert_internal_consistency(ZSTD_cwksp* ws) {
    (void)ws;
    assert(ws->workspace <= ws->objectEnd);
    assert(ws->objectEnd <= ws->tableEnd);
    assert(ws->objectEnd <= ws->tableValidEnd);
    assert(ws->tableEnd <= ws->allocStart);
    assert(ws->tableValidEnd <= ws->allocStart);
    assert(ws->allocStart <= ws->workspaceEnd);
    assert(ws->initOnceStart <= ZSTD_cwksp_initialAllocStart(ws));
    assert(ws->workspace <= ws->initOnceStart);
#if ZSTD_MEMORY_SANITIZER
    {
        intptr_t const offset = __msan_test_shadow(ws->initOnceStart,
            (U8*)ZSTD_cwksp_initialAllocStart(ws) - (U8*)ws->initOnceStart);
#if defined(ZSTD_MSAN_PRINT)
        if(offset!=-1) {
            __msan_print_shadow((U8*)ws->initOnceStart + offset - 8, 32);
        }
#endif
        assert(offset==-1);
    };
#endif
}